

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<MyPairIndex>::resize
          (cbtAlignedObjectArray<MyPairIndex> *this,int newsize,MyPairIndex *fillData)

{
  int iVar1;
  MyPairIndex *pMVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = this->m_size;
  lVar4 = (long)iVar1;
  if (iVar1 <= newsize) {
    if (iVar1 < newsize) {
      reserve(this,newsize);
    }
    lVar3 = lVar4 * 0xc;
    for (; lVar4 < newsize; lVar4 = lVar4 + 1) {
      pMVar2 = this->m_data;
      *(int *)((long)&pMVar2->m_uidA1 + lVar3) = fillData->m_uidA1;
      *(undefined8 *)((long)&pMVar2->m_orgIndex + lVar3) = *(undefined8 *)fillData;
      lVar3 = lVar3 + 0xc;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}